

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

int mdns_query_send(int sock,mdns_record_type_t type,char *name,size_t length,void *buffer,
                   size_t capacity)

{
  uint16_t uVar1;
  int iVar2;
  uint16_t *puVar3;
  ssize_t sVar4;
  socklen_t local_fc;
  sockaddr *psStack_f8;
  socklen_t saddrlen;
  sockaddr *saddr;
  sockaddr_in6 addr6;
  sockaddr_in addr;
  sockaddr_storage addr_storage;
  uint16_t *data;
  size_t capacity_local;
  void *buffer_local;
  size_t length_local;
  char *name_local;
  mdns_record_type_t type_local;
  int sock_local;
  
  if (capacity < length + 0x11) {
    type_local = ~MDNS_RECORDTYPE_IGNORE;
  }
  else {
    mdns_transaction_id = mdns_transaction_id + 1;
    uVar1 = htons(mdns_transaction_id);
    *(uint16_t *)buffer = uVar1;
    *(undefined2 *)((long)buffer + 2) = 0;
    uVar1 = htons(1);
    *(uint16_t *)((long)buffer + 4) = uVar1;
    *(undefined2 *)((long)buffer + 6) = 0;
    *(undefined2 *)((long)buffer + 8) = 0;
    *(undefined2 *)((long)buffer + 10) = 0;
    puVar3 = (uint16_t *)mdns_string_make((void *)((long)buffer + 0xc),capacity - 0x11,name,length);
    if (puVar3 == (uint16_t *)0x0) {
      type_local = ~MDNS_RECORDTYPE_IGNORE;
    }
    else {
      uVar1 = htons((uint16_t)type);
      *puVar3 = uVar1;
      uVar1 = htons(0x8001);
      puVar3[1] = uVar1;
      psStack_f8 = (sockaddr *)addr.sin_zero;
      local_fc = 0x80;
      iVar2 = getsockname(sock,psStack_f8,&local_fc);
      if (iVar2 == 0) {
        if (*(short *)psStack_f8 == 10) {
          memset((void *)((long)&saddr + 4),0,0x1c);
          saddr._4_2_ = 10;
          addr6.sin6_family._0_1_ = 0xff;
          addr6.sin6_family._1_1_ = 2;
          addr6.sin6_addr.__in6_u.__u6_addr8[7] = 0xfb;
          saddr._6_2_ = htons(0x14e9);
          psStack_f8 = (sockaddr *)((long)&saddr + 4);
          local_fc = 0x1c;
        }
        else {
          memset((void *)((long)&addr6.sin6_addr.__in6_u + 0xc),0,0x10);
          addr6.sin6_addr.__in6_u.__u6_addr16[6] = 2;
          addr6.sin6_scope_id = htonl(0xe00000fb);
          addr6.sin6_addr.__in6_u.__u6_addr16[7] = htons(0x14e9);
          psStack_f8 = (sockaddr *)((long)&addr6.sin6_addr.__in6_u + 0xc);
          local_fc = 0x10;
        }
        sVar4 = sendto(sock,buffer,(long)puVar3 + (4 - (long)buffer),0,psStack_f8,local_fc);
        if (sVar4 < 0) {
          type_local = ~MDNS_RECORDTYPE_IGNORE;
        }
        else {
          type_local = MDNS_RECORDTYPE_IGNORE;
        }
      }
      else {
        type_local = ~MDNS_RECORDTYPE_IGNORE;
      }
    }
  }
  return type_local;
}

Assistant:

int
mdns_query_send(int sock, mdns_record_type_t type, const char* name, size_t length,
                void* buffer, size_t capacity) {
	if (capacity < (17 + length))
		return -1;

	uint16_t* data = (uint16_t*)buffer;
	//Transaction ID
	*data++ = htons(++mdns_transaction_id);
	//Flags
	*data++ = 0;
	//Questions
	*data++ = htons(1);
	//No answer, authority or additional RRs
	*data++ = 0;
	*data++ = 0;
	*data++ = 0;
	//Name string
	data = (uint16_t*)mdns_string_make(data, capacity - 17, name, length);
	if (!data)
		return -1;
	//Record type
	*data++ = htons(type);
	//! Unicast response, class IN
	*data++ = htons(0x8000U | MDNS_CLASS_IN);

	struct sockaddr_storage addr_storage;
	struct sockaddr_in addr;
	struct sockaddr_in6 addr6;
	struct sockaddr* saddr = (struct sockaddr*)&addr_storage;
	socklen_t saddrlen = sizeof(struct sockaddr_storage);
	if (getsockname(sock, saddr, &saddrlen))
		return -1;
	if (saddr->sa_family == AF_INET6) {
		memset(&addr6, 0, sizeof(struct sockaddr_in6));
		addr6.sin6_family = AF_INET6;
#ifdef __APPLE__
		addr6.sin6_len = sizeof(struct sockaddr_in6);
#endif
		addr6.sin6_addr.s6_addr[0] = 0xFF;
		addr6.sin6_addr.s6_addr[1] = 0x02;
		addr6.sin6_addr.s6_addr[15] = 0xFB;
		addr6.sin6_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr6;
		saddrlen = sizeof(struct sockaddr_in6);
	}
	else {
		memset(&addr, 0, sizeof(struct sockaddr_in));
		addr.sin_family = AF_INET;
#ifdef __APPLE__
		addr.sin_len = sizeof(struct sockaddr_in);
#endif
		addr.sin_addr.s_addr = htonl((((uint32_t)224U) << 24U) | ((uint32_t)251U));
		addr.sin_port = htons((unsigned short)5353);
		saddr = (struct sockaddr*)&addr;
		saddrlen = sizeof(struct sockaddr_in);
	}

	if (sendto(sock, buffer, (char*)data - (char*)buffer, 0,
	           saddr, saddrlen) < 0)
		return -1;
	return 0;
}